

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

AssertionResult *
iutest::internal::backward::NeHelper<false>::CmpHelper<std::vector<int,_std::allocator<int>_>,_true>
::Compare(AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,
         vector<int,_std::allocator<int>_> *val1,vector<int,_std::allocator<int>_> *val2)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *unaff_RBX;
  
  bVar1 = iuOperatorNE<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                    (val1,val2);
  if (bVar1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    CmpHelperOpFailure<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              (__return_storage_ptr__,(internal *)expr1,expr2,"!=",(char *)val1,val2,unaff_RBX);
  }
  return __return_storage_ptr__;
}

Assistant:

static AssertionResult Compare(const char* expr1, const char* expr2, const T& val1, const T& val2)
        {
            return CmpHelperNE(expr1, expr2, val1, val2);
        }